

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::task_pool::join(task_pool *this)

{
  task *ptVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  task tsk;
  task tStack_38;
  
  tStack_38.field_2._0_4_ = 0;
  tStack_38._20_8_ = 0;
  tStack_38.m_data = 0;
  tStack_38.m_pData_ptr._0_4_ = 0;
  tStack_38.m_pData_ptr._4_4_ = 0;
  spinlock::lock((spinlock *)this);
  iVar3 = (this->m_task_stack).m_top;
  while (0 < iVar3) {
    uVar5 = iVar3 - 1;
    (this->m_task_stack).m_top = uVar5;
    ptVar1 = (this->m_task_stack).m_stack + uVar5;
    tStack_38.m_data = ptVar1->m_data;
    pvVar4 = ptVar1->m_pData_ptr;
    puVar2 = (undefined8 *)((long)&(this->m_task_stack).m_stack[uVar5].m_pData_ptr + 4);
    tStack_38._20_8_ = puVar2[1];
    tStack_38.field_2._0_4_ = (undefined4)((ulong)*puVar2 >> 0x20);
    tStack_38.m_pData_ptr._0_4_ = SUB84(pvVar4,0);
    tStack_38.m_pData_ptr._4_4_ = (undefined4)((ulong)pvVar4 >> 0x20);
    spinlock::unlock((spinlock *)this);
    process_task(this,&tStack_38);
    spinlock::lock((spinlock *)this);
    iVar3 = (this->m_task_stack).m_top;
  }
  spinlock::unlock((spinlock *)this);
  lVar6 = (long)(int)this->m_total_submitted_tasks;
  if (this->m_total_completed_tasks != lVar6) {
    do {
      semaphore::wait(&this->m_all_tasks_completed,(void *)0x1);
    } while (this->m_total_completed_tasks != lVar6);
  }
  return;
}

Assistant:

void task_pool::join()
    {
        // Try to steal any outstanding tasks. This could cause one or more worker threads to wake up and immediately go back to sleep, which is wasteful but should be harmless.
        task tsk;
        while (m_task_stack.pop(tsk))
        {
            process_task(tsk);
        }

        // At this point the task stack is empty.
        // Now wait for all concurrent tasks to complete. The m_all_tasks_completed semaphore has a max count of 1, so it's possible it could have saturated to 1 as the tasks
        // where issued and asynchronously completed, so this loop may iterate a few times.
        const int total_submitted_tasks = atomic_add32(&m_total_submitted_tasks, 0);
        while (m_total_completed_tasks != total_submitted_tasks)
        {
            // If the previous (m_total_completed_tasks != total_submitted_tasks) check failed the semaphore MUST be eventually signalled once the last task completes.
            // So I think this can actually be an INFINITE delay, but it shouldn't really matter if it's 1ms.
            m_all_tasks_completed.wait(1);
        }
    }